

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  lts_20250127 *this_00;
  bool bVar1;
  EnumValueDescriptor *this_01;
  char add_float_suffix;
  uint uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t *psVar4;
  EnumValueDescriptor *descriptor;
  AlphaNum *a;
  objectivec *this_02;
  char *pcVar5;
  Nullable<const_char_*> p;
  string *this_03;
  AlphaNum *in_R8;
  string_view src;
  string_view to_escape;
  string_view src_00;
  string_view to_escape_00;
  AlphaNum local_150;
  string bytes;
  string local_100;
  string local_e0;
  AlphaNum local_c0;
  string local_90;
  string local_70;
  AlphaNum local_50;
  
  this_02 = this;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)this);
  if (bVar1) goto switchD_00243f3d_caseD_a;
  uVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) - 1;
  if (9 < uVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/helpers.cc"
               ,0x131);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_150,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_150);
  }
  add_float_suffix = (char)(&switchD_00243f3d::switchdataD_0051fde0)[uVar2] + -0x20;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_150,*(int *)(this + 0x50));
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_150,a);
    return __return_storage_ptr__;
  case 2:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_150,*(long *)(this + 0x50));
    p = "LL";
    break;
  case 3:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_150,*(uint *)(this + 0x50));
    p = "U";
    break;
  case 4:
    absl::lts_20250127::AlphaNum::AlphaNum(&local_150,*(unsigned_long *)(this + 0x50));
    p = "ULL";
    break;
  case 5:
    io::SimpleDtoa_abi_cxx11_(&local_70,(io *)this_02,*(double *)(this + 0x50));
    anon_unknown_0::HandleExtremeFloatingPoint
              (__return_storage_ptr__,(anon_unknown_0 *)&local_70,(string *)0x0,
               (bool)add_float_suffix);
    this_03 = &local_70;
    goto LAB_0024411c;
  case 6:
    io::SimpleFtoa_abi_cxx11_(&local_90,(io *)this_02,*(float *)(this + 0x50));
    anon_unknown_0::HandleExtremeFloatingPoint
              (__return_storage_ptr__,(anon_unknown_0 *)&local_90,(string *)0x1,
               (bool)add_float_suffix);
    this_03 = &local_90;
LAB_0024411c:
    std::__cxx11::string::~string((string *)this_03);
    return __return_storage_ptr__;
  case 7:
    pcVar5 = "NO";
    if (this[0x50] != (objectivec)0x0) {
      pcVar5 = "YES";
    }
    goto LAB_00243ef6;
  case 8:
    this_01 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    EnumValueName_abi_cxx11_(__return_storage_ptr__,(objectivec *)this_01,descriptor);
    return __return_storage_ptr__;
  case 9:
    psVar4 = *(size_t **)(this + 0x50);
    this_00 = (lts_20250127 *)psVar4[1];
    if (((byte)this[1] & this_00 != (lts_20250127 *)0x0) != 0) {
      pcVar5 = (char *)*psVar4;
      if (this[2] == (objectivec)0xc) {
        bytes.field_2._M_allocated_capacity._0_4_ = ghtonl((uint32_t)this_00);
        paVar3 = &bytes.field_2;
        bytes._M_string_length = 4;
        bytes.field_2._M_local_buf[4] = '\0';
        local_150.piece_._M_str = pcVar5;
        local_150.piece_._M_len = (size_t)this_00;
        bytes._M_dataplus._M_p = (pointer)paVar3;
        absl::lts_20250127::StrAppend(&bytes,&local_150);
        local_150.piece_ = absl::lts_20250127::NullSafeStringView("(NSData*)\"");
        src._M_str = (char *)paVar3;
        src._M_len = (size_t)bytes._M_dataplus._M_p;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_e0,(lts_20250127 *)bytes._M_string_length,src)
        ;
        to_escape._M_str = (char *)paVar3;
        to_escape._M_len = (size_t)local_e0._M_dataplus._M_p;
        EscapeTrigraphs_abi_cxx11_(&local_100,(objectivec *)local_e0._M_string_length,to_escape);
        local_50.piece_ = absl::lts_20250127::NullSafeStringView("\"");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_150,&local_c0,&local_50,in_R8);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
        this_03 = &bytes;
      }
      else {
        local_150.piece_ = absl::lts_20250127::NullSafeStringView("@\"");
        src_00._M_str = (char *)psVar4;
        src_00._M_len = (size_t)pcVar5;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_100,this_00,src_00);
        to_escape_00._M_str = (char *)psVar4;
        to_escape_00._M_len = (size_t)local_100._M_dataplus._M_p;
        EscapeTrigraphs_abi_cxx11_(&bytes,(objectivec *)local_100._M_string_length,to_escape_00);
        local_50.piece_ = absl::lts_20250127::NullSafeStringView("\"");
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_150,&local_c0,&local_50,in_R8);
        std::__cxx11::string::~string((string *)&bytes);
        this_03 = &local_100;
      }
      goto LAB_0024411c;
    }
  case 10:
switchD_00243f3d_caseD_a:
    pcVar5 = "nil";
LAB_00243ef6:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar5,(allocator<char> *)&local_150);
    return __return_storage_ptr__;
  }
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView(p);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_150,&local_c0,&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field) {
  // Repeated fields don't have defaults.
  if (field->is_repeated()) {
    return "nil";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int32() == INT_MIN) {
        return "-0x80000000";
      }
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return absl::StrCat(field->default_value_uint32(), "U");
    case FieldDescriptor::CPPTYPE_INT64:
      // gcc and llvm reject the decimal form of kint32min and kint64min.
      if (field->default_value_int64() == LLONG_MIN) {
        return "-0x8000000000000000LL";
      }
      return absl::StrCat(field->default_value_int64(), "LL");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(field->default_value_uint64(), "ULL");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return HandleExtremeFloatingPoint(
          io::SimpleDtoa(field->default_value_double()), false);
    case FieldDescriptor::CPPTYPE_FLOAT:
      return HandleExtremeFloatingPoint(
          io::SimpleFtoa(field->default_value_float()), true);
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "YES" : "NO";
    case FieldDescriptor::CPPTYPE_STRING: {
      const bool has_default_value = field->has_default_value();
      absl::string_view default_string = field->default_value_string();
      if (!has_default_value || default_string.empty()) {
        // If the field is defined as being the empty string,
        // then we will just assign to nil, as the empty string is the
        // default for both strings and data.
        return "nil";
      }
      if (field->type() == FieldDescriptor::TYPE_BYTES) {
        // We want constant fields in our data structures so we can
        // declare them as static. To achieve this we cheat and stuff
        // a escaped c string (prefixed with a length) into the data
        // field, and cast it to an (NSData*) so it will compile.
        // The runtime library knows how to handle it.

        // Must convert to a standard byte order for packing length into
        // a cstring.
        uint32_t length = ghtonl((uint32_t)default_string.length());
        std::string bytes((const char*)&length, sizeof(length));
        absl::StrAppend(&bytes, default_string);
        return absl::StrCat("(NSData*)\"",
                            EscapeTrigraphs(absl::CEscape(bytes)), "\"");
      } else {
        return absl::StrCat(
            "@\"", EscapeTrigraphs(absl::CEscape(default_string)), "\"");
      }
    }
    case FieldDescriptor::CPPTYPE_ENUM:
      return EnumValueName(field->default_value_enum());
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "nil";
  }

  // Some compilers report reaching end of function even though all cases of
  // the enum are handed in the switch.
  ABSL_LOG(FATAL) << "Can't get here.";
  return std::string();
}